

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O0

wchar_t header_old_tar(archive_read *a,tar *tar,archive_entry *entry,void *h)

{
  wchar_t wVar1;
  char *pcVar2;
  wchar_t *pwVar3;
  wchar_t *existing_wcs_pathname;
  char *existing_pathname;
  wchar_t err2;
  wchar_t err;
  archive_entry_header_ustar *header;
  void *h_local;
  archive_entry *entry_local;
  tar *tar_local;
  archive_read *a_local;
  
  existing_pathname._4_4_ = L'\0';
  pcVar2 = archive_entry_pathname(entry);
  pwVar3 = archive_entry_pathname_w(entry);
  if ((((pcVar2 != (char *)0x0) && (*pcVar2 != '\0')) ||
      ((pwVar3 != (wchar_t *)0x0 && (*pwVar3 != L'\0')))) ||
     ((wVar1 = _archive_entry_copy_pathname_l(entry,(char *)h,100,tar->sconv), wVar1 == L'\0' ||
      (existing_pathname._4_4_ = set_conversion_failed_error(a,tar->sconv,"Pathname"),
      a_local._4_4_ = existing_pathname._4_4_, existing_pathname._4_4_ != L'\xffffffe2')))) {
    wVar1 = header_common(a,tar,entry,h);
    if (wVar1 < existing_pathname._4_4_) {
      existing_pathname._4_4_ = wVar1;
    }
    tar->entry_padding = -tar->entry_bytes_remaining & 0x1ff;
    a_local._4_4_ = existing_pathname._4_4_;
  }
  return a_local._4_4_;
}

Assistant:

static int
header_old_tar(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h)
{
	const struct archive_entry_header_ustar	*header;
	int err = ARCHIVE_OK, err2;

	/*
	 * Copy filename over (to ensure null termination).
	 * Skip if pathname was already set e.g. by header_gnu_longname()
	 */
	header = (const struct archive_entry_header_ustar *)h;

	const char *existing_pathname = archive_entry_pathname(entry);
	const wchar_t *existing_wcs_pathname = archive_entry_pathname_w(entry);
	if ((existing_pathname == NULL || existing_pathname[0] == '\0')
	    && (existing_wcs_pathname == NULL || existing_wcs_pathname[0] == '\0') &&
	    archive_entry_copy_pathname_l(entry,
	    header->name, sizeof(header->name), tar->sconv) != 0) {
		err = set_conversion_failed_error(a, tar->sconv, "Pathname");
		if (err == ARCHIVE_FATAL)
			return (err);
	}

	/* Grab rest of common fields */
	err2 = header_common(a, tar, entry, h);
	if (err > err2)
		err = err2;

	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}